

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::impl::operator>>(basic_istream<char,_std::char_traits<char>_> *in,uint128 *value)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint128 *puVar6;
  ulong uVar7;
  ulong uVar8;
  int_type c;
  long extraout_RDX;
  uint128 *puVar9;
  ulong uVar10;
  ulong uVar11;
  anon_class_1_0_00000001 hex_digit_to_uint128;
  
  uVar3 = *(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  std::ws<char,std::char_traits<char>>((istream *)in);
  uVar2 = std::istream::peek();
  if ((uVar3 & 0x4a) == 8) {
    if ((uVar2 - 0x30 < 10) ||
       ((uVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(uVar2 - 0x41) & 0x3f) & 1) != 0)))) {
      iVar4 = 1;
      uVar10 = 0;
      puVar9 = (uint128 *)0x0;
      do {
        iVar5 = std::istream::peek();
        if ((iVar5 - 0x30U < 10) ||
           ((iVar5 - 0x41U < 0x26 && ((0x3f0000003fU >> ((ulong)(iVar5 - 0x41U) & 0x3f) & 1) != 0)))
           ) {
          if (iVar4 == 0) goto LAB_001aee45;
LAB_001aee5f:
          if (uVar10 >> 0x3c != 0) break;
          uVar7 = (long)puVar9 * 0x10;
          uVar3 = std::istream::get();
          puVar6 = operator>><char,_std::char_traits<char>,_trng::optimized_impl::uint128>::
                   anon_class_1_0_00000001::operator()
                             ((uint128 *)&hex_digit_to_uint128,
                              (anon_class_1_0_00000001 *)(ulong)uVar3,c);
          uVar11 = (ulong)puVar9 >> 0x3c;
          puVar9 = puVar6 + (long)puVar9;
          uVar10 = (uVar10 << 4 | uVar11) + extraout_RDX + (ulong)CARRY8((ulong)puVar6,uVar7);
        }
        else {
          if ((iVar4 != 0) || (uVar3 = std::istream::peek(), (uVar3 & 0xffffffdf) != 0x58)) {
            *(uint128 **)&value->value = puVar9;
            goto LAB_001aef6e;
          }
LAB_001aee45:
          uVar3 = std::istream::peek();
          if ((uVar3 & 0xffffffdf) != 0x58) goto LAB_001aee5f;
          std::istream::get();
        }
        iVar4 = iVar4 + -1;
      } while( true );
    }
  }
  else if ((uVar3 & 0x4a) == 0x40) {
    if ((uVar2 & 0xfffffff8) == 0x30) {
      uVar11 = 0;
      uVar10 = 0;
      while( true ) {
        uVar3 = std::istream::peek();
        if ((uVar3 & 0xfffffff8) != 0x30) {
          *(ulong *)&value->value = uVar11;
          *(ulong *)((long)&value->value + 8) = uVar10;
          return in;
        }
        if (uVar10 >> 0x3d != 0) break;
        uVar7 = uVar11 * 8;
        iVar4 = std::istream::get();
        uVar8 = uVar11 >> 0x3d;
        uVar11 = (long)(iVar4 + -0x30) + uVar7;
        uVar10 = (uVar10 << 3 | uVar8) + (ulong)CARRY8((long)(iVar4 + -0x30),uVar7);
      }
    }
  }
  else if (uVar2 - 0x30 < 10) {
    uVar11 = 0;
    uVar10 = 0;
    do {
      iVar4 = std::istream::peek();
      if (9 < iVar4 - 0x30U) {
        *(ulong *)&value->value = uVar11;
LAB_001aef6e:
        *(ulong *)((long)&value->value + 8) = uVar10;
        return in;
      }
      if (0x1999999999999998 < uVar10 &&
          (ulong)(uVar11 < 0x999999999999999a) <= uVar10 + 0xe666666666666667) break;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar11;
      uVar7 = SUB168(auVar1 * ZEXT816(10),0);
      uVar10 = uVar10 * 10 + SUB168(auVar1 * ZEXT816(10),8);
      iVar4 = std::istream::get();
      uVar8 = (ulong)(iVar4 + -0x30);
      if (~uVar10 < (ulong)(~uVar7 < uVar8)) break;
      uVar11 = uVar7 + uVar8;
      uVar10 = uVar10 + CARRY8(uVar7,uVar8);
    } while( true );
  }
  std::ios::setstate((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  return in;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }